

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams_00;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  bool bVar13;
  U32 UVar14;
  size_t sVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong *puVar21;
  BYTE *pBVar22;
  ulong *puVar23;
  ulong uVar24;
  BYTE *ip;
  ulong *puVar25;
  ulong *puVar26;
  U32 UVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  U32 UVar31;
  ZSTD_compressionParameters *cParams;
  BYTE *local_148;
  ulong local_f0;
  U32 local_e4;
  BYTE *local_80;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar9 + uVar5;
  UVar27 = *rep;
  UVar31 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar25 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar25 < puVar4) {
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    do {
      puVar23 = (ulong *)((long)puVar25 + 1);
      iVar29 = (int)puVar25;
      uVar19 = ((iVar29 - (int)pBVar9) - UVar27) + 1;
      pBVar22 = pBVar9;
      if (uVar19 < uVar5) {
        pBVar22 = pBVar10;
      }
      bVar13 = true;
      if ((uVar6 < uVar19 && 2 < (uVar5 - 1) - uVar19) &&
         (*(int *)puVar23 == *(int *)(pBVar22 + uVar19))) {
        puVar26 = iEnd;
        if (uVar19 < uVar5) {
          puVar26 = (ulong *)(pBVar10 + uVar5);
        }
        sVar15 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)((long)(pBVar22 + uVar19) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar26,iStart);
        local_80 = (BYTE *)(sVar15 + 4);
        bVar13 = false;
      }
      else {
        local_80 = (BYTE *)0x0;
      }
      if (bVar13) {
        uVar19 = (ms->cParams).minMatch;
        if (uVar19 - 6 < 2) {
          uVar28 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar22 = (ms->window).base;
          pBVar17 = (ms->window).dictBase;
          uVar19 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar30 = iVar29 - (int)pBVar22;
          uVar20 = uVar30 - uVar28;
          if (uVar30 < uVar28) {
            uVar20 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar25,6);
          if (uVar7 < UVar14) {
            iVar29 = 1 << ((byte)uVar8 & 0x1f);
            local_f0 = 999999999;
            local_148 = (BYTE *)0x3;
            do {
              if (UVar14 < uVar19) {
                if (*(int *)(pBVar17 + UVar14) == (int)*puVar25) {
                  sVar15 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar25 + 4),pBVar17 + (ulong)UVar14 + 4,
                                      (BYTE *)iEnd,pBVar17 + uVar19,pBVar22 + uVar19);
                  pBVar16 = (BYTE *)(sVar15 + 4);
                }
                else {
LAB_001452f1:
                  pBVar16 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar22 + UVar14);
                if (local_148[(long)puVar26] != *(BYTE *)((long)puVar25 + (long)local_148))
                goto LAB_001452f1;
                puVar21 = puVar25;
                if (puVar25 < puVar1) {
                  uVar18 = *puVar25 ^ *puVar26;
                  uVar24 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  pBVar16 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                  if (*puVar26 == *puVar25) {
                    do {
                      puVar21 = puVar21 + 1;
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar21) goto LAB_001452f8;
                      uVar18 = *puVar21 ^ *puVar26;
                      uVar24 = 0;
                      if (uVar18 != 0) {
                        for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                        }
                      }
                      pBVar16 = (BYTE *)((long)puVar21 +
                                        ((uVar24 >> 3 & 0x1fffffff) - (long)puVar25));
                    } while (*puVar26 == *puVar21);
                  }
                }
                else {
LAB_001452f8:
                  if ((puVar21 < puVar2) && ((int)*puVar26 == (int)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar21 < puVar3) && ((short)*puVar26 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar21 < iEnd) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar21));
                  }
                  pBVar16 = (BYTE *)((long)puVar21 - (long)puVar25);
                }
              }
              if ((local_148 < pBVar16) &&
                 (local_f0 = (ulong)((uVar30 + 2) - UVar14), local_148 = pBVar16,
                 (ulong *)(pBVar16 + (long)puVar25) == iEnd)) {
                bVar13 = false;
              }
              else if (uVar20 < UVar14) {
                UVar14 = pUVar11[UVar14 & uVar28 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            } while (((bVar13) && (uVar7 < UVar14)) && (iVar29 = iVar29 + -1, iVar29 != 0));
          }
          else {
            local_148 = (BYTE *)0x3;
            local_f0 = 999999999;
          }
        }
        else if (uVar19 == 5) {
          uVar30 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar22 = (ms->window).base;
          pBVar17 = (ms->window).dictBase;
          uVar19 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar20 = iVar29 - (int)pBVar22;
          uVar28 = uVar20 - uVar30;
          if (uVar20 < uVar30) {
            uVar28 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar25,5);
          if (uVar7 < UVar14) {
            iVar29 = 1 << ((byte)uVar8 & 0x1f);
            local_f0 = 999999999;
            local_148 = (BYTE *)0x3;
            do {
              if (UVar14 < uVar19) {
                if (*(int *)(pBVar17 + UVar14) == (int)*puVar25) {
                  sVar15 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar25 + 4),pBVar17 + (ulong)UVar14 + 4,
                                      (BYTE *)iEnd,pBVar17 + uVar19,pBVar22 + uVar19);
                  pBVar16 = (BYTE *)(sVar15 + 4);
                }
                else {
LAB_0014560c:
                  pBVar16 = (BYTE *)0x0;
                }
              }
              else {
                puVar26 = (ulong *)(pBVar22 + UVar14);
                if (local_148[(long)puVar26] != *(BYTE *)((long)puVar25 + (long)local_148))
                goto LAB_0014560c;
                puVar21 = puVar25;
                if (puVar25 < puVar1) {
                  uVar18 = *puVar25 ^ *puVar26;
                  uVar24 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  pBVar16 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                  if (*puVar26 == *puVar25) {
                    do {
                      puVar21 = puVar21 + 1;
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar21) goto LAB_00145613;
                      uVar18 = *puVar21 ^ *puVar26;
                      uVar24 = 0;
                      if (uVar18 != 0) {
                        for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                        }
                      }
                      pBVar16 = (BYTE *)((long)puVar21 +
                                        ((uVar24 >> 3 & 0x1fffffff) - (long)puVar25));
                    } while (*puVar26 == *puVar21);
                  }
                }
                else {
LAB_00145613:
                  if ((puVar21 < puVar2) && ((int)*puVar26 == (int)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar21 < puVar3) && ((short)*puVar26 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar21 < iEnd) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar21));
                  }
                  pBVar16 = (BYTE *)((long)puVar21 - (long)puVar25);
                }
              }
              if ((local_148 < pBVar16) &&
                 (local_f0 = (ulong)((uVar20 + 2) - UVar14), local_148 = pBVar16,
                 (ulong *)(pBVar16 + (long)puVar25) == iEnd)) {
                bVar13 = false;
              }
              else if (uVar28 < UVar14) {
                UVar14 = pUVar11[UVar14 & uVar30 - 1];
                bVar13 = true;
              }
              else {
                bVar13 = false;
              }
            } while (((bVar13) && (uVar7 < UVar14)) && (iVar29 = iVar29 + -1, iVar29 != 0));
          }
          else {
LAB_001459ac:
            local_148 = (BYTE *)0x3;
            local_f0 = 999999999;
          }
        }
        else {
          uVar30 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pUVar11 = ms->chainTable;
          pBVar22 = (ms->window).base;
          pBVar17 = (ms->window).dictBase;
          uVar19 = (ms->window).dictLimit;
          uVar7 = (ms->window).lowLimit;
          uVar20 = iVar29 - (int)pBVar22;
          uVar28 = uVar20 - uVar30;
          if (uVar20 < uVar30) {
            uVar28 = 0;
          }
          uVar8 = (ms->cParams).searchLog;
          UVar14 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar25,4);
          if (UVar14 <= uVar7) goto LAB_001459ac;
          iVar29 = 1 << ((byte)uVar8 & 0x1f);
          local_f0 = 999999999;
          local_148 = (BYTE *)0x3;
          do {
            if (UVar14 < uVar19) {
              if (*(int *)(pBVar17 + UVar14) == (int)*puVar25) {
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar25 + 4),pBVar17 + (ulong)UVar14 + 4,
                                    (BYTE *)iEnd,pBVar17 + uVar19,pBVar22 + uVar19);
                pBVar16 = (BYTE *)(sVar15 + 4);
              }
              else {
LAB_001458e7:
                pBVar16 = (BYTE *)0x0;
              }
            }
            else {
              puVar26 = (ulong *)(pBVar22 + UVar14);
              if (local_148[(long)puVar26] != *(BYTE *)((long)puVar25 + (long)local_148))
              goto LAB_001458e7;
              puVar21 = puVar25;
              if (puVar25 < puVar1) {
                uVar18 = *puVar25 ^ *puVar26;
                uVar24 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar26 == *puVar25) {
                  do {
                    puVar21 = puVar21 + 1;
                    puVar26 = puVar26 + 1;
                    if (puVar1 <= puVar21) goto LAB_001458ee;
                    uVar18 = *puVar21 ^ *puVar26;
                    uVar24 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar21 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar25))
                    ;
                  } while (*puVar26 == *puVar21);
                }
              }
              else {
LAB_001458ee:
                if ((puVar21 < puVar2) && ((int)*puVar26 == (int)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar21 < puVar3) && ((short)*puVar26 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar21 < iEnd) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar21));
                }
                pBVar16 = (BYTE *)((long)puVar21 - (long)puVar25);
              }
            }
            if ((local_148 < pBVar16) &&
               (local_f0 = (ulong)((uVar20 + 2) - UVar14), local_148 = pBVar16,
               (ulong *)(pBVar16 + (long)puVar25) == iEnd)) {
              bVar13 = false;
            }
            else if (uVar28 < UVar14) {
              UVar14 = pUVar11[UVar14 & uVar30 - 1];
              bVar13 = true;
            }
            else {
              bVar13 = false;
            }
          } while (((bVar13) && (uVar7 < UVar14)) && (iVar29 = iVar29 + -1, iVar29 != 0));
        }
        local_e4 = 1;
        puVar26 = puVar25;
        if (local_148 <= local_80) {
          local_f0 = 0;
          local_148 = local_80;
          puVar26 = puVar23;
        }
        puVar23 = puVar26;
        if ((BYTE *)0x3 < local_148) {
          if (local_f0 == 0) {
            uVar24 = (ulong)UVar31;
            local_80 = local_148;
          }
          else {
            pBVar16 = (BYTE *)((long)puVar23 + (2 - (long)(pBVar9 + local_f0)));
            pBVar17 = iStart;
            pBVar22 = pBVar9;
            if ((uint)pBVar16 < uVar5) {
              pBVar17 = pBVar10 + uVar6;
              pBVar22 = pBVar10;
            }
            if ((src < puVar23) &&
               (uVar24 = (ulong)pBVar16 & 0xffffffff, pBVar17 < pBVar22 + uVar24)) {
              pBVar22 = pBVar22 + uVar24;
              do {
                puVar25 = (ulong *)((long)puVar23 + -1);
                pBVar22 = pBVar22 + -1;
                if ((*(BYTE *)puVar25 != *pBVar22) ||
                   (local_148 = local_148 + 1, puVar23 = puVar25, puVar25 <= src)) break;
              } while (pBVar17 < pBVar22);
            }
            uVar24 = (ulong)UVar27;
            UVar27 = (int)local_f0 - 2;
            local_e4 = (int)local_f0 + 1;
            local_80 = local_148;
          }
          goto LAB_00145b02;
        }
        puVar25 = (ulong *)((long)puVar25 + ((long)puVar25 - (long)src >> 8) + 1);
      }
      else {
        local_e4 = 1;
        uVar24 = (ulong)UVar31;
LAB_00145b02:
        uVar18 = (long)puVar23 - (long)src;
        puVar26 = (ulong *)seqStore->lit;
        puVar25 = (ulong *)((long)puVar26 + uVar18);
        do {
          *puVar26 = *src;
          puVar26 = puVar26 + 1;
          src = (void *)((long)src + 8);
        } while (puVar26 < puVar25);
        seqStore->lit = seqStore->lit + uVar18;
        if (0xffff < uVar18) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar18;
        psVar12->offset = local_e4;
        if ((BYTE *)0xffff < local_80 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(local_80 + -3);
        seqStore->sequences = psVar12 + 1;
        src = (void *)((long)puVar23 + (long)local_80);
        puVar25 = (ulong *)src;
        do {
          UVar31 = (U32)uVar24;
          if (puVar4 < puVar25) break;
          uVar19 = (uint)((long)puVar25 - (long)(pBVar9 + uVar24));
          pBVar22 = pBVar9;
          if (uVar19 < uVar5) {
            pBVar22 = pBVar10;
          }
          if ((uVar6 < uVar19 && 2 < (uVar5 - 1) - uVar19) &&
             ((int)*puVar25 ==
              *(int *)(pBVar22 + ((long)puVar25 - (long)(pBVar9 + uVar24) & 0xffffffff)))) {
            puVar23 = iEnd;
            if (uVar19 < uVar5) {
              puVar23 = (ulong *)(pBVar10 + uVar5);
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar25 + 4),
                                (BYTE *)((long)(pBVar22 +
                                               ((long)puVar25 - (long)(pBVar9 + uVar24) & 0xffffffff
                                               )) + 4),(BYTE *)iEnd,(BYTE *)puVar23,iStart);
            *(ulong *)seqStore->lit = *src;
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < sVar15 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(sVar15 + 1);
            seqStore->sequences = psVar12 + 1;
            src = (void *)((long)puVar25 + sVar15 + 4);
            bVar13 = true;
            puVar25 = (ulong *)src;
            UVar14 = UVar27;
            UVar27 = UVar31;
          }
          else {
            bVar13 = false;
            UVar14 = UVar31;
          }
          UVar31 = UVar14;
          uVar24 = (ulong)UVar31;
        } while (bVar13);
      }
    } while (puVar25 < puVar4);
  }
  *rep = UVar27;
  rep[1] = UVar31;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 0, 0);
}